

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall absl::synchronization_internal::GraphCycles::CheckInvariants(GraphCycles *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  Node **ppNVar4;
  char *absl_raw_logging_internal_basename_3;
  Node *ny;
  int32_t _cursor;
  int32_t y;
  char *absl_raw_logging_internal_basename_2;
  char *absl_raw_logging_internal_basename_1;
  char *absl_raw_logging_internal_basename;
  void *ptr;
  Node *nx;
  uint local_54;
  undefined1 local_50 [4];
  uint32_t x;
  NodeSet ranks;
  Rep *r;
  GraphCycles *this_local;
  
  ranks._48_8_ = this->rep_;
  anon_unknown_0::NodeSet::NodeSet((NodeSet *)local_50);
  for (local_54 = 0; uVar3 = local_54,
      uVar2 = anon_unknown_0::Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::
              size((Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*> *)
                   ranks._48_8_), uVar3 < uVar2; local_54 = local_54 + 1) {
    ppNVar4 = anon_unknown_0::Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[]((Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*> *)
                         ranks._48_8_,local_54);
    ptr = *ppNVar4;
    absl_raw_logging_internal_basename =
         (char *)base_internal::UnhidePtr<void>(((Node *)ptr)->masked_ptr);
    if ((absl_raw_logging_internal_basename != (char *)0x0) &&
       (uVar3 = anon_unknown_0::PointerMap::Find
                          ((PointerMap *)(ranks._48_8_ + 0x80),absl_raw_logging_internal_basename),
       uVar3 != local_54)) {
      absl_raw_logging_internal_basename_1 = "graphcycles.cc";
      raw_logging_internal::RawLog
                (kFatal,"graphcycles.cc",0x183,"Did not find live node in hash table %u %p",
                 (ulong)local_54,absl_raw_logging_internal_basename);
    }
    if ((*(byte *)((long)ptr + 0xc) & 1) != 0) {
      absl_raw_logging_internal_basename_2 = "graphcycles.cc";
      raw_logging_internal::RawLog
                (kFatal,"graphcycles.cc",0x186,"Did not clear visited marker on node %u",
                 (ulong)local_54);
    }
    bVar1 = anon_unknown_0::NodeSet::insert((NodeSet *)local_50,*ptr);
    if (!bVar1) {
      __cursor = "graphcycles.cc";
      raw_logging_internal::RawLog
                (kFatal,"graphcycles.cc",0x189,"Duplicate occurrence of rank %d",(ulong)*ptr);
    }
    ny._0_4_ = 0;
    while (bVar1 = anon_unknown_0::NodeSet::Next
                             ((NodeSet *)((long)ptr + 0x50),(int32_t *)&ny,
                              (int32_t *)((long)&ny + 4)), bVar1) {
      ppNVar4 = anon_unknown_0::Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*>::
                operator[]((Vec<absl::synchronization_internal::(anonymous_namespace)::Node_*> *)
                           ranks._48_8_,ny._4_4_);
      if ((*ppNVar4)->rank <= *ptr) {
        raw_logging_internal::RawLog
                  (kFatal,"graphcycles.cc",399,"Edge %u->%d has bad rank assignment %d->%d",
                   (ulong)local_54,(ulong)ny._4_4_,*ptr,(*ppNVar4)->rank);
      }
    }
  }
  anon_unknown_0::NodeSet::~NodeSet((NodeSet *)local_50);
  return true;
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (uint32_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = r->nodes_[x];
    void* ptr = base_internal::UnhidePtr<void>(nx->masked_ptr);
    if (ptr != nullptr && static_cast<uint32_t>(r->ptrmap_.Find(ptr)) != x) {
      ABSL_RAW_LOG(FATAL, "Did not find live node in hash table %u %p", x, ptr);
    }
    if (nx->visited) {
      ABSL_RAW_LOG(FATAL, "Did not clear visited marker on node %u", x);
    }
    if (!ranks.insert(nx->rank)) {
      ABSL_RAW_LOG(FATAL, "Duplicate occurrence of rank %d", nx->rank);
    }
    HASH_FOR_EACH(y, nx->out) {
      Node* ny = r->nodes_[y];
      if (nx->rank >= ny->rank) {
        ABSL_RAW_LOG(FATAL, "Edge %u->%d has bad rank assignment %d->%d", x, y,
                     nx->rank, ny->rank);
      }
    }
  }
  return true;
}